

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O1

int rops_adoption_bind_h1(lws *wsi,int type,char *vh_prot_name)

{
  lws_vhost *plVar1;
  int iVar2;
  lws_protocols *plVar3;
  lwsi_state state;
  
  if ((type & 1U) == 0) {
    return 0;
  }
  if (((uint)type >> 0x18 & 1) != 0) {
    if (wsi->role_ops != &role_ops_h1 && wsi->role_ops != &role_ops_h2) {
      return 0;
    }
    iVar2 = lws_header_table_attach(wsi,0);
    if (iVar2 != 0) {
      _lws_log(8,"%s: waiting for ah\n","rops_adoption_bind_h1");
      return 1;
    }
    _lws_log(0x10,"Attached ah immediately\n");
    return 1;
  }
  state = LRS_SSL_INIT;
  if ((type & 4U) == 0) {
    state = LRS_HEADERS;
  }
  lws_role_transition(wsi,0x20000000,state,&role_ops_h1);
  if (vh_prot_name == (char *)0x0) {
    plVar1 = wsi->vhost;
    if ((int)(uint)plVar1->default_protocol_index < plVar1->count_protocols) {
      plVar3 = plVar1->protocols + plVar1->default_protocol_index;
      goto LAB_0011fc9e;
    }
  }
  plVar3 = wsi->vhost->protocols;
LAB_0011fc9e:
  wsi->protocol = plVar3;
  lws_set_timeout(wsi,PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,wsi->context->timeout_secs);
  return 1;
}

Assistant:

static int
rops_adoption_bind_h1(struct lws *wsi, int type, const char *vh_prot_name)
{
	if (!(type & LWS_ADOPT_HTTP))
		return 0; /* no match */

	if (type & _LWS_ADOPT_FINISH && !lwsi_role_http(wsi))
		return 0;

	if (type & _LWS_ADOPT_FINISH) {
		if (!lws_header_table_attach(wsi, 0))
			lwsl_debug("Attached ah immediately\n");
		else
			lwsl_info("%s: waiting for ah\n", __func__);

		return 1;
	}

	lws_role_transition(wsi, LWSIFR_SERVER, (type & LWS_ADOPT_ALLOW_SSL) ?
			    LRS_SSL_INIT : LRS_HEADERS, &role_ops_h1);

	/*
	 * We have to bind to h1 as a default even when we're actually going to
	 * replace it as an h2 bind later.  So don't take this seriously if the
	 * default is disabled (ws upgrade caees properly about it)
	 */

	if (!vh_prot_name && wsi->vhost->default_protocol_index <
			     wsi->vhost->count_protocols)
		wsi->protocol = &wsi->vhost->protocols[
				wsi->vhost->default_protocol_index];
	else
		wsi->protocol = &wsi->vhost->protocols[0];

	/* the transport is accepted... give him time to negotiate */
	lws_set_timeout(wsi, PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,
			wsi->context->timeout_secs);

	return 1; /* bound */
}